

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

Instruction * __thiscall spvtools::opt::IRContext::KillInst(IRContext *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  DefUseManager *this_00;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *this_01;
  reference inst_00;
  pointer this_02;
  DebugInfoManager *pDVar4;
  pointer this_03;
  pointer this_04;
  IRContext *local_50;
  Instruction *next_instruction;
  Instruction *l_inst;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range3;
  DefUseManager *def_use_mgr;
  Instruction *inst_local;
  IRContext *this_local;
  
  if (inst == (Instruction *)0x0) {
    this_local = (IRContext *)0x0;
  }
  else {
    def_use_mgr = (DefUseManager *)inst;
    inst_local = (Instruction *)this;
    KillNamesAndDecorates(this,inst);
    KillOperandFromDebugInstructions(this,(Instruction *)def_use_mgr);
    bVar1 = AreAnalysesValid(this,kAnalysisBegin);
    if (bVar1) {
      this_00 = get_def_use_mgr(this);
      analysis::DefUseManager::ClearInst(this_00,(Instruction *)def_use_mgr);
      this_01 = Instruction::dbg_line_insts((Instruction *)def_use_mgr);
      __end3 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ::begin(this_01);
      l_inst = (Instruction *)
               std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                         *)&l_inst), bVar1) {
        inst_00 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                  ::operator*(&__end3);
        analysis::DefUseManager::ClearInst(this_00,inst_00);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
        ::operator++(&__end3);
      }
    }
    bVar1 = AreAnalysesValid(this,kAnalysisInstrToBlockMapping);
    if (bVar1) {
      std::
      unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
      ::erase(&this->instr_to_block_,(key_type *)&def_use_mgr);
    }
    bVar1 = AreAnalysesValid(this,kAnalysisDecorations);
    if ((bVar1) && (bVar1 = Instruction::IsDecoration((Instruction *)def_use_mgr), bVar1)) {
      this_02 = std::
                unique_ptr<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                ::operator->(&this->decoration_mgr_);
      analysis::DecorationManager::RemoveDecoration(this_02,(Instruction *)def_use_mgr);
    }
    bVar1 = AreAnalysesValid(this,kAnalysisDebugInfo);
    if (bVar1) {
      pDVar4 = get_debug_info_mgr(this);
      analysis::DebugInfoManager::ClearDebugScopeAndInlinedAtUses(pDVar4,(Instruction *)def_use_mgr)
      ;
      pDVar4 = get_debug_info_mgr(this);
      analysis::DebugInfoManager::ClearDebugInfo(pDVar4,(Instruction *)def_use_mgr);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->type_mgr_);
    if (bVar1) {
      OVar3 = Instruction::opcode((Instruction *)def_use_mgr);
      bVar1 = IsTypeInst(OVar3);
      if (bVar1) {
        this_03 = std::
                  unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  ::operator->(&this->type_mgr_);
        uVar2 = Instruction::result_id((Instruction *)def_use_mgr);
        analysis::TypeManager::RemoveId(this_03,uVar2);
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->constant_mgr_);
    if (bVar1) {
      OVar3 = Instruction::opcode((Instruction *)def_use_mgr);
      bVar1 = IsConstantInst(OVar3);
      if (bVar1) {
        this_04 = std::
                  unique_ptr<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                  ::operator->(&this->constant_mgr_);
        uVar2 = Instruction::result_id((Instruction *)def_use_mgr);
        analysis::ConstantManager::RemoveId(this_04,uVar2);
      }
    }
    OVar3 = Instruction::opcode((Instruction *)def_use_mgr);
    if ((OVar3 == OpCapability) ||
       (OVar3 = Instruction::opcode((Instruction *)def_use_mgr), OVar3 == OpExtension)) {
      ResetFeatureManager(this);
    }
    RemoveFromIdToName(this,(Instruction *)def_use_mgr);
    local_50 = (IRContext *)0x0;
    bVar1 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::IsInAList
                      ((IntrusiveNodeBase<spvtools::opt::Instruction> *)def_use_mgr);
    if (bVar1) {
      local_50 = (IRContext *)
                 utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                           ((IntrusiveNodeBase<spvtools::opt::Instruction> *)def_use_mgr);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
                ((IntrusiveNodeBase<spvtools::opt::Instruction> *)def_use_mgr);
      if (def_use_mgr != (DefUseManager *)0x0) {
        (*(code *)(def_use_mgr->id_to_def_)._M_h._M_buckets[1])();
      }
    }
    else {
      Instruction::ToNop((Instruction *)def_use_mgr);
    }
    this_local = local_50;
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* IRContext::KillInst(Instruction* inst) {
  if (!inst) {
    return nullptr;
  }

  KillNamesAndDecorates(inst);

  KillOperandFromDebugInstructions(inst);

  if (AreAnalysesValid(kAnalysisDefUse)) {
    analysis::DefUseManager* def_use_mgr = get_def_use_mgr();
    def_use_mgr->ClearInst(inst);
    for (auto& l_inst : inst->dbg_line_insts()) def_use_mgr->ClearInst(&l_inst);
  }
  if (AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
    instr_to_block_.erase(inst);
  }
  if (AreAnalysesValid(kAnalysisDecorations)) {
    if (inst->IsDecoration()) {
      decoration_mgr_->RemoveDecoration(inst);
    }
  }
  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ClearDebugScopeAndInlinedAtUses(inst);
    get_debug_info_mgr()->ClearDebugInfo(inst);
  }
  if (type_mgr_ && IsTypeInst(inst->opcode())) {
    type_mgr_->RemoveId(inst->result_id());
  }
  if (constant_mgr_ && IsConstantInst(inst->opcode())) {
    constant_mgr_->RemoveId(inst->result_id());
  }
  if (inst->opcode() == spv::Op::OpCapability ||
      inst->opcode() == spv::Op::OpExtension) {
    // We reset the feature manager, instead of updating it, because it is just
    // as much work.  We would have to remove all capabilities implied by this
    // capability that are not also implied by the remaining OpCapability
    // instructions. We could update extensions, but we will see if it is
    // needed.
    ResetFeatureManager();
  }

  RemoveFromIdToName(inst);

  Instruction* next_instruction = nullptr;
  if (inst->IsInAList()) {
    next_instruction = inst->NextNode();
    inst->RemoveFromList();
    delete inst;
  } else {
    // Needed for instructions that are not part of a list like OpLabels,
    // OpFunction, OpFunctionEnd, etc..
    inst->ToNop();
  }
  return next_instruction;
}